

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O0

Status __thiscall
bloomfilter::BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8>::Contain
          (BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8> *this,
          unsigned_long *key)

{
  ulong uVar1;
  uint64_t uVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t *in_RDI;
  int i;
  uint64_t b;
  uint64_t a;
  uint64_t hash;
  size_t in_stack_ffffffffffffffa8;
  SimpleMixSplit *in_stack_ffffffffffffffb0;
  int local_34;
  ulong local_28;
  
  uVar2 = hashing::SimpleMixSplit::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_28 = uVar2 >> 0x20;
  local_34 = 0;
  while( true ) {
    if (7 < local_34) {
      return Ok;
    }
    uVar4 = *in_RDI;
    sVar3 = fastrangesize(uVar4,in_stack_ffffffffffffffa8);
    uVar1 = *(ulong *)(uVar4 + sVar3 * 8);
    uVar4 = getBit((uint32_t)local_28);
    if ((uVar1 & uVar4) == 0) break;
    local_28 = uVar2 + local_28;
    local_34 = local_34 + 1;
  }
  return NotFound;
}

Assistant:

Status BloomFilter<ItemType, bits_per_item, branchless, HashFamily, k>::Contain(
    const ItemType &key) const {
  uint64_t hash = hasher(key);
  uint64_t a = (hash >> 32) | (hash << 32);;
  uint64_t b = hash;
  if (branchless && k >= 3) {
    int b0 = data[fastrangesize(a, this->arrayLength)] >> (a & 63);
    a += b;
    int b1 = data[fastrangesize(a, this->arrayLength)] >> (a & 63);
    a += b;
    int b2 = data[fastrangesize(a, this->arrayLength)] >> (a & 63);
    if ((b0 & b1 & b2 & 1) == 0) {
        return NotFound;
    }
    for (int i = 3; i < k; i++) {
      a += b;
      if (((data[fastrangesize(a, this->arrayLength)] >> (a & 63)) & 1) == 0) {
          return NotFound;
      }
    }
    return Ok;
  }
  for (int i = 0; i < k; i++) {
    if ((data[fastrangesize(a, this->arrayLength)] & getBit(a)) == 0) {
      return NotFound;
    }
    a += b;
  }
  return Ok;
}